

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall slang::ast::Compilation::resolveDefParamsAndBinds(Compilation *this)

{
  pointer pbVar1;
  SyntaxNode *pSVar2;
  pointer pOVar3;
  bool bVar4;
  RootSymbol *pRVar5;
  Diagnostic *pDVar6;
  DefinitionSymbol *pDVar7;
  ulong uVar8;
  int7 iVar10;
  Symbol *this_00;
  SyntaxNode *pSVar9;
  byte *pbVar11;
  int iVar12;
  Compilation *c;
  long lVar13;
  uint uVar14;
  pointer unaff_R14;
  string_view sVar15;
  SourceRange SVar16;
  TimeTraceScope timeScope;
  DefParamVisitor v_1;
  anon_class_16_2_91181a89 cloneInto;
  anon_class_24_3_8f1a74c6 saveState;
  anon_class_24_3_973e07f5 copyStateInto;
  SmallVector<BindEntry,_2UL> binds;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  SmallVector<OverrideEntry,_4UL> overrides;
  Compilation initialClone;
  TimeTraceScope local_1dc5;
  uint local_1dc4;
  byte *local_1dc0;
  undefined1 local_1db1;
  pointer local_1db0;
  pointer local_1da8;
  Compilation *local_1da0;
  pointer local_1d98;
  ulong local_1d90;
  undefined1 local_1d88 [16];
  Segment local_1d78;
  undefined8 *local_1d68;
  pointer *local_1d60;
  undefined1 local_1d58 [16];
  group_type_pointer local_1d48;
  Segment local_1d40;
  size_t sStack_1d30;
  value_type_pointer local_1d18;
  size_t local_1d10;
  undefined1 *local_1d08;
  pointer local_1d00;
  pointer local_1cf8;
  pointer pbStack_1cf0;
  pointer local_1ce8;
  pointer local_1ce0;
  pointer local_1cd8;
  undefined8 local_1cd0 [3];
  InstanceSymbol *local_1cb8;
  anon_class_16_2_91181a89 local_1cb0;
  anon_class_24_3_8f1a74c6 local_1ca0;
  undefined1 local_1c88 [24];
  SmallVector<BindEntry,_2UL> local_1c70;
  undefined1 local_1b58 [16];
  group_type_pointer local_1b48;
  Segment local_1b40;
  size_t sStack_1b30;
  size_t local_1b18;
  group_type_pointer local_1b10;
  value_type_pointer local_1b08;
  void *local_1b00;
  size_t local_1af8;
  group_type_pointer pgStack_1af0;
  value_type_pointer local_1ae8;
  group_type_pointer local_1ae0;
  pointer local_1ad8;
  pointer local_1ad0 [3];
  InstanceSymbol *local_1ab8;
  SmallVector<OverrideEntry,_4UL> local_f00;
  Compilation local_c88;
  
  if (TimeTrace::profiler != 0) {
    sVar15._M_str = "resolveDefParamsAndBinds";
    sVar15._M_len = 0x18;
    TimeTrace::beginTrace(sVar15,(string_view)(ZEXT816(0x9db414) << 0x40));
  }
  local_f00.super_SmallVectorBase<OverrideEntry>.data_ =
       (pointer)local_f00.super_SmallVectorBase<OverrideEntry>.firstElement;
  local_f00.super_SmallVectorBase<OverrideEntry>.len = 0;
  local_f00.super_SmallVectorBase<OverrideEntry>.cap = 4;
  local_1c70.super_SmallVectorBase<BindEntry>.data_ =
       (pointer)local_1c70.super_SmallVectorBase<BindEntry>.firstElement;
  local_1c70.super_SmallVectorBase<BindEntry>.len = 0;
  local_1c70.super_SmallVectorBase<BindEntry>.cap = 2;
  local_1ca0.overrides = &local_f00;
  local_1cb0.copyStateInto = (anon_class_24_3_973e07f5 *)local_1c88;
  local_1c88._8_8_ = &local_1db1;
  local_1ca0.binds = &local_1c70;
  local_1d60 = local_1ad0;
  local_1d68 = local_1cd0;
  local_1db0 = (pointer)0x0;
  local_1d98 = (pointer)0x0;
  local_1dc0 = (byte *)0x0;
  local_1d90 = 0;
  local_1da8 = unaff_R14;
  local_1da0 = this;
  local_1cb0.this = this;
  local_1ca0.this = this;
  local_1c88._0_8_ = local_1ca0.overrides;
  local_1c88._16_8_ = local_1ca0.binds;
  do {
    while( true ) {
      local_1b58._0_8_ = (Segment *)0x3f;
      local_1b58._8_8_ = (byte *)0x1;
      local_1b40.prev = (Segment *)0x0;
      local_1b48 = (group_type_pointer)
                   &boost::unordered::detail::foa::
                    dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                    ::storage;
      local_1b40.current = (byte *)0x0;
      sStack_1b30 = 0;
      Compilation(&local_c88,(Bag *)local_1b58,this->defaultLibPtr);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                     *)local_1b58);
      resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()(&local_1cb0,&local_c88);
      do {
        pbVar11 = local_1dc0;
        local_1ae0 = (group_type_pointer)(ulong)(this->options).maxInstanceDepth;
        local_1b58._0_8_ = &local_1b40;
        local_1b58._8_8_ = (byte *)0x0;
        local_1b48 = (group_type_pointer)0x5;
        local_1b18 = 0x3f;
        local_1b10 = (group_type_pointer)0x1;
        local_1b00 = (void *)0x0;
        local_1b08 = (value_type_pointer)
                     &boost::unordered::detail::foa::
                      dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                      ::storage;
        local_1ae8 = (value_type_pointer)0x0;
        local_1af8 = 0;
        pgStack_1af0 = (group_type_pointer)0x0;
        local_1ad8 = local_1d98;
        local_1ab8 = (InstanceSymbol *)0x0;
        *local_1d60 = (pointer)0x0;
        local_1d60[1] = (pointer)0x0;
        *(undefined1 *)(local_1d60 + 2) = 0;
        pRVar5 = getRoot(&local_c88,true);
        c = (Compilation *)local_1b58;
        Symbol::visit<slang::ast::DefParamVisitor&>(&pRVar5->super_Symbol,(DefParamVisitor *)c);
        if (local_1ab8 == (InstanceSymbol *)0x0) {
          if ((pbVar11 < (ulong)local_1b58._8_8_) ||
             (local_1d90 <
              (ulong)((long)local_c88.bindDirectives.
                            super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c88.bindDirectives.
                            super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4))) {
            local_1dc0 = (byte *)local_1b58._8_8_;
            local_1da8 = local_1ad0[0];
            iVar12 = 5;
            c = (Compilation *)local_1b58;
            resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                      (&local_1ca0,(DefParamVisitor *)c,&local_c88);
          }
          else {
            pbVar1 = local_1db0;
            if (local_1ad0[0] == local_1db0) {
              iVar12 = 5;
              c = (Compilation *)local_1b58;
              resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                        (&local_1ca0,(DefParamVisitor *)c,&local_c88);
              local_1dc0 = pbVar11;
              local_1da8 = pbVar1;
            }
            else {
              local_1d98 = (pointer)((long)&(local_1d98->_M_dataplus)._M_p + 1);
              iVar12 = 0;
              local_1dc0 = pbVar11;
              local_1db0 = local_1ad0[0];
              local_1da8 = local_1ad0[0];
            }
          }
        }
        else {
          pDVar6 = Scope::addDiag(&((this->root)._M_t.
                                    super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                    .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                   _M_head_impl)->super_Scope,(DiagCode)0x25000d,
                                  (local_1ab8->super_InstanceSymbolBase).super_Symbol.location);
          pDVar7 = InstanceSymbol::getDefinition(local_1ab8);
          sVar15 = DefinitionSymbol::getKindString(pDVar7);
          Diagnostic::operator<<(pDVar6,sVar15);
          local_1d58._0_8_ = ZEXT48((this->options).maxInstanceDepth);
          c = (Compilation *)local_1d58;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)c);
          iVar12 = 1;
          local_1dc0 = pbVar11;
        }
        if (local_1b00 != (void *)0x0) {
          c = (Compilation *)((long)local_1b10 * 0x88 + 0x90);
          operator_delete(local_1b00,(size_t)c);
        }
        if ((Segment *)local_1b58._0_8_ != &local_1b40) {
          operator_delete((void *)local_1b58._0_8_);
        }
      } while (iVar12 == 0);
      if (iVar12 == 5) break;
LAB_0080c370:
      ~Compilation(&local_c88);
      if ((iVar12 != 0) && (iVar12 != 2)) {
        if (iVar12 == 3) {
LAB_0080c409:
          c = this;
          resolveDefParamsAndBinds::anon_class_24_3_973e07f5::operator()
                    ((anon_class_24_3_973e07f5 *)local_1c88,c,true);
        }
        SmallVectorBase<BindEntry>::cleanup
                  (&local_1c70.super_SmallVectorBase<BindEntry>,(EVP_PKEY_CTX *)c);
        SmallVectorBase<OverrideEntry>::cleanup
                  (&local_f00.super_SmallVectorBase<OverrideEntry>,(EVP_PKEY_CTX *)c);
        TimeTraceScope::~TimeTraceScope(&local_1dc5);
        return;
      }
    }
    uVar8 = (long)local_c88.bindDirectives.
                  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_c88.bindDirectives.
                  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (local_1d90 < uVar8) {
      local_1dc0 = (byte *)0x0;
      local_1d90 = uVar8;
    }
    else {
      iVar10 = (int7)((long)local_c88.bindDirectives.
                            super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c88.bindDirectives.
                            super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 0xc);
      if ((this->options).maxDefParamSteps == 0) {
        local_1dc4 = (uint)CONCAT71(iVar10,1);
      }
      else {
        uVar14 = 0;
        local_1dc4 = (uint)CONCAT71(iVar10,1);
        do {
          local_1d58._0_8_ = (Segment *)0x3f;
          local_1d58._8_8_ = (byte *)0x1;
          local_1d40.prev = (Segment *)0x0;
          local_1d48 = (group_type_pointer)
                       &boost::unordered::detail::foa::
                        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                        ::storage;
          local_1d40.current = (byte *)0x0;
          sStack_1d30 = 0;
          Compilation((Compilation *)local_1b58,(Bag *)local_1d58,this->defaultLibPtr);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                         *)local_1d58);
          resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()
                    (&local_1cb0,(Compilation *)local_1b58);
          local_1ce0 = (pointer)(ulong)(this->options).maxInstanceDepth;
          local_1d58._0_8_ = &local_1d40;
          local_1d58._8_8_ = (byte *)0x0;
          local_1d48 = (group_type_pointer)0x5;
          local_1d18 = (value_type_pointer)0x3f;
          local_1d10 = 1;
          local_1d00 = (pointer)0x0;
          local_1d08 = &boost::unordered::detail::foa::
                        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                        ::storage;
          local_1ce8 = (pointer)0x0;
          local_1cf8 = (pointer)0x0;
          pbStack_1cf0 = (pointer)0x0;
          local_1cd8 = local_1d98;
          local_1cb8 = (InstanceSymbol *)0x0;
          *local_1d68 = 0;
          local_1d68[1] = 0;
          *(undefined1 *)(local_1d68 + 2) = 0;
          pRVar5 = getRoot((Compilation *)local_1b58,true);
          c = (Compilation *)local_1d58;
          Symbol::visit<slang::ast::DefParamVisitor&>(&pRVar5->super_Symbol,(DefParamVisitor *)c);
          if (local_1cb8 == (InstanceSymbol *)0x0) {
            iVar12 = 6;
            local_1dc4 = 1;
            if ((byte *)local_1d58._8_8_ != (byte *)0x0) {
              lVar13 = 0x78;
              pbVar11 = (byte *)0x0;
              do {
                this_00 = DefParamSymbol::getTarget
                                    ((DefParamSymbol *)((Segment **)local_1d58._0_8_)[(long)pbVar11]
                                    );
                pOVar3 = local_f00.super_SmallVectorBase<OverrideEntry>.data_;
                if (this_00 == (Symbol *)0x0) {
                  pSVar9 = (SyntaxNode *)0x0;
                }
                else {
                  pSVar9 = this_00->originatingSyntax;
                }
                pSVar2 = *(SyntaxNode **)
                          (((local_f00.super_SmallVectorBase<OverrideEntry>.data_)->path).entries.
                           super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.firstElement
                          + lVar13 + -0x50);
                if (((pSVar2 != pSVar9) && (pSVar9 != (SyntaxNode *)0x0)) &&
                   (pSVar2 != (SyntaxNode *)0x0)) {
                  pRVar5 = (local_1da0->root)._M_t.
                           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
                  SVar16 = slang::syntax::SyntaxNode::sourceRange
                                     ((SyntaxNode *)
                                      ((Segment **)local_1d58._0_8_)[(long)pbVar11][3].current);
                  pDVar6 = Scope::addDiag(&pRVar5->super_Scope,(DiagCode)0xa000d,SVar16);
                  Diagnostic::operator<<
                            (pDVar6,(string *)
                                    ((pOVar3->path).entries.
                                     super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>.
                                     firstElement + lVar13 + -0x18));
                  c = (Compilation *)local_1d88;
                  Symbol::getHierarchicalPath_abi_cxx11_((string *)c,this_00);
                  Diagnostic::operator<<(pDVar6,(string *)c);
                  this = local_1da0;
                  if ((Segment *)local_1d88._0_8_ != &local_1d78) {
                    c = (Compilation *)((long)&(local_1d78.prev)->prev + 1);
                    operator_delete((void *)local_1d88._0_8_,(size_t)c);
                  }
                  goto LAB_0080c161;
                }
                c = (Compilation *)
                    DefParamSymbol::getValue
                              ((DefParamSymbol *)((Segment **)local_1d58._0_8_)[(long)pbVar11]);
                bVar4 = slang::operator==((ConstantValue *)
                                          ((pOVar3->path).entries.
                                           super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>
                                           .firstElement + lVar13 + -0x40),(ConstantValue *)c);
                this = local_1da0;
                if (!bVar4) {
                  if (uVar14 == (local_1da0->options).maxDefParamSteps - 1) {
                    pRVar5 = (local_1da0->root)._M_t.
                             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
                    SVar16 = slang::syntax::SyntaxNode::sourceRange
                                       ((SyntaxNode *)
                                        ((Segment **)local_1d58._0_8_)[(long)pbVar11][3].current);
                    Scope::addDiag(&pRVar5->super_Scope,(DiagCode)0x9000d,SVar16);
                  }
                  local_1dc4 = 0;
                  c = (Compilation *)local_1d58;
                  resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                            (&local_1ca0,(DefParamVisitor *)c,(Compilation *)local_1b58);
                  iVar12 = 0;
                  break;
                }
                pbVar11 = pbVar11 + 1;
                lVar13 = lVar13 + 0x98;
              } while (pbVar11 < (ulong)local_1d58._8_8_);
            }
          }
          else {
            pDVar6 = Scope::addDiag(&((this->root)._M_t.
                                      super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                      .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                     _M_head_impl)->super_Scope,(DiagCode)0x25000d,
                                    (local_1cb8->super_InstanceSymbolBase).super_Symbol.location);
            pDVar7 = InstanceSymbol::getDefinition(local_1cb8);
            sVar15 = DefinitionSymbol::getKindString(pDVar7);
            Diagnostic::operator<<(pDVar6,sVar15);
            local_1d88._0_8_ = ZEXT48((this->options).maxInstanceDepth);
            c = (Compilation *)local_1d88;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)c);
LAB_0080c161:
            iVar12 = 1;
          }
          if (local_1d00 != (pointer)0x0) {
            c = (Compilation *)(local_1d10 * 0x88 + 0x90);
            operator_delete(local_1d00,(size_t)c);
          }
          if ((Segment *)local_1d58._0_8_ != &local_1d40) {
            operator_delete((void *)local_1d58._0_8_);
          }
          ~Compilation((Compilation *)local_1b58);
          if (iVar12 != 0) {
            if (iVar12 != 6) goto LAB_0080c370;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (this->options).maxDefParamSteps);
      }
      if (((local_1dc4 & 1) == 0) || (local_1da8 == local_1db0)) {
        ~Compilation(&local_c88);
        goto LAB_0080c409;
      }
      local_1d98 = (pointer)((long)&(local_1d98->_M_dataplus)._M_p + 1);
      local_1db0 = local_1da8;
    }
    pbVar1 = local_1da8;
    ~Compilation(&local_c88);
    local_1da8 = pbVar1;
  } while( true );
}

Assistant:

void Compilation::resolveDefParamsAndBinds() {
    TimeTraceScope timeScope("resolveDefParamsAndBinds"sv, ""sv);

    struct OverrideEntry {
        OpaqueInstancePath path;
        const SyntaxNode* targetSyntax = nullptr;
        const SyntaxNode* defparamSyntax = nullptr;
        ConstantValue value;
        std::string pathStr;
    };
    SmallVector<OverrideEntry, 4> overrides;

    struct BindEntry {
        OpaqueInstancePath path;
        const ModuleDeclarationSyntax* definitionTarget = nullptr;
        BindDirectiveInfo info;
    };
    SmallVector<BindEntry> binds;

    auto getNodeFor = [](const OpaqueInstancePath& path, Compilation& c) {
        HierarchyOverrideNode* node = &c.hierarchyOverrides;
        for (auto& entry : path.entries)
            node = &node->childNodes[entry];
        return node;
    };

    auto copyStateInto = [&](Compilation& c, bool isFinal) {
        for (auto& entry : overrides) {
            if (!entry.targetSyntax)
                continue;

            SLANG_ASSERT(entry.defparamSyntax);

            auto node = getNodeFor(entry.path, c);
            auto [it, inserted] = node->paramOverrides.emplace(
                entry.targetSyntax, std::pair{entry.value, entry.defparamSyntax});

            if (!inserted && isFinal) {
                SLANG_ASSERT(it->second.second);
                auto& diag = c.root->addDiag(diag::DuplicateDefparam,
                                             entry.defparamSyntax->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, it->second.second->sourceRange());
            }
        }

        for (auto& entry : binds) {
            if (entry.definitionTarget) {
                if (!entry.path.empty()) {
                    // This is a nested definition, so we need to put the
                    // bind into the override node.
                    auto node = getNodeFor(entry.path, c);
                    node->binds.push_back({entry.info, entry.definitionTarget});
                }
                else {
                    auto def = c.getDefinition(*c.root, *entry.definitionTarget);
                    if (def) {
                        // const_cast is fine; we accessed the private data of the compilation
                        // through a public interface that added the const on top.
                        const_cast<DefinitionSymbol*>(def)->bindDirectives.push_back(entry.info);
                    }
                }
            }
            else {
                auto node = getNodeFor(entry.path, c);
                node->binds.push_back({entry.info, nullptr});
            }
        }
    };

    auto cloneInto = [&](Compilation& c) {
        c.diagsDisabled = true;
        c.options = options;
        for (auto& tree : syntaxTrees)
            c.addSyntaxTree(tree);

        copyStateInto(c, false);
    };

    auto saveState = [&](DefParamVisitor& visitor, Compilation& c) {
        overrides.clear();
        for (auto defparam : visitor.found) {
            auto target = defparam->getTarget();
            if (!target) {
                overrides.emplace_back();
            }
            else {
                overrides.push_back({OpaqueInstancePath(*target), target->getSyntax(),
                                     defparam->getSyntax(), defparam->getValue(),
                                     target->getHierarchicalPath()});
            }
        }

        // We make a copy of the bind directives list here because resolveBindTargets
        // can cause the compilation to add more entries to the list (for recursive
        // module instantiations).
        binds.clear();
        auto bindDirs = c.bindDirectives;
        for (auto [syntax, scope] : bindDirs) {
            ResolvedBind resolvedBind;
            c.resolveBindTargets(*syntax, *scope, resolvedBind);

            BindDirectiveInfo info;
            info.bindSyntax = syntax;

            auto& def = resolvedBind.instanceDef;
            info.configRuleSyntax = def.configRule ? def.configRule->syntax.get() : nullptr;
            info.configBlockSyntax = def.configRoot ? def.configRoot->getSyntax() : nullptr;
            info.instantiationDefSyntax = def.definition ? def.definition->getSyntax() : nullptr;
            info.isNewConfigRoot = def.configRoot != nullptr;
            if (!info.isNewConfigRoot && resolvedBind.resolvedConfig) {
                info.configBlockSyntax = resolvedBind.resolvedConfig->useConfig.getSyntax();

                // Make a copy of the list; the memory for it is owned by
                // the old compilation that is going away.
                info.liblist = copyFrom(resolvedBind.resolvedConfig->liblist);
            }

            for (auto target : resolvedBind.instTargets)
                binds.emplace_back(BindEntry{OpaqueInstancePath(*target), nullptr, info});

            if (auto defTarget = resolvedBind.defTarget) {
                auto parentScope = defTarget->getParentScope();
                auto defSyntax = defTarget->getSyntax();
                SLANG_ASSERT(parentScope && defSyntax);

                // If this is a nested definition we'll put it into the
                // override node of the parent scope that contains the
                // definition. Otherwise it's a globally targeted bind.
                OpaqueInstancePath path;
                auto& parentSym = parentScope->asSymbol();
                if (parentSym.kind != SymbolKind::CompilationUnit)
                    path = OpaqueInstancePath(parentSym);

                binds.emplace_back(
                    BindEntry{std::move(path), &defSyntax->as<ModuleDeclarationSyntax>(), info});
            }
        }
    };

    auto checkProblem = [&](const DefParamVisitor& visitor) {
        if (visitor.hierarchyProblem) {
            auto& diag = root->addDiag(diag::MaxInstanceDepthExceeded,
                                       visitor.hierarchyProblem->location);
            diag << visitor.hierarchyProblem->getDefinition().getKindString();
            diag << options.maxInstanceDepth;
            return true;
        }
        return false;
    };

    // [23.10.4.1] gives an algorithm for elaboration in the face of defparams.
    // Specifically, we need to resolve all possible defparams at one "level" of
    // hierarchy before moving on to a deeper level, where a "level" in this case
    // is each successive set of nested generate blocks.
    size_t generateLevel = 0;
    size_t numBlocksSeen = 0;
    size_t numBindsSeen = 0;
    size_t numDefParamsSeen = 0;
    while (true) {
        // Traverse the design and find all defparams and their values.
        // defparam resolution happens in a cloned compilation unit because we will be
        // constantly mucking with parameter values in ways that can change the actual
        // hierarchy that gets instantiated. Cloning lets us do that in an isolated context
        // and throw that work away once we know the final parameter values.
        Compilation initialClone({}, defaultLibPtr);
        cloneInto(initialClone);

        size_t currBlocksSeen;
        auto nextIt = [&] {
            // If we haven't found any new blocks we're done iterating.
            SLANG_ASSERT(currBlocksSeen >= numBlocksSeen);
            if (currBlocksSeen == numBlocksSeen)
                return true;

            // Otherwise advance into the next blocks and try again.
            generateLevel++;
            numBlocksSeen = currBlocksSeen;
            return false;
        };

        while (true) {
            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            initialClone.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            currBlocksSeen = v.numBlocksSeen;
            if (v.found.size() > numDefParamsSeen ||
                initialClone.bindDirectives.size() > numBindsSeen) {
                numDefParamsSeen = v.found.size();
                saveState(v, initialClone);
                break;
            }

            // We didn't find any more binds or defparams so increase
            // our generate level and try again.
            if (nextIt()) {
                saveState(v, initialClone);
                break;
            }
        }

        // If we have found more binds, do another visit to let them be applied
        // and potentially add blocks and defparams to our set for this level.
        if (initialClone.bindDirectives.size() > numBindsSeen) {
            // Reset the number of defparams seen to ensure that
            // we re-resolve everything after the next iteration.
            numDefParamsSeen = 0;
            numBindsSeen = initialClone.bindDirectives.size();
            continue;
        }

        // defparams can change the value of parameters, further affecting the value of
        // other defparams elsewhere in the design. This means we need to iterate,
        // reevaluating defparams until they all settle to a stable value or until we
        // give up due to the potential of cyclical references.
        bool allSame = true;
        for (uint32_t i = 0; i < options.maxDefParamSteps; i++) {
            Compilation c({}, defaultLibPtr);
            cloneInto(c);

            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            c.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            // We're only done if we have the same set of defparams with the same set of values.
            allSame = true;
            SLANG_ASSERT(v.found.size() == overrides.size());
            for (size_t j = 0; j < v.found.size(); j++) {
                // Check that the defparam resolved to the same target we saw previously.
                // The spec declares it to be an error if a defparam target changes based
                // on elaboration of other defparam values.
                const SyntaxNode* targetNode = nullptr;
                auto target = v.found[j]->getTarget();
                if (target)
                    targetNode = target->getSyntax();

                auto getRange = [&] {
                    auto syntax = v.found[j]->getSyntax();
                    SLANG_ASSERT(syntax);
                    return syntax->sourceRange();
                };

                auto& prevEntry = overrides[j];
                if (prevEntry.targetSyntax && targetNode && prevEntry.targetSyntax != targetNode) {
                    auto& diag = root->addDiag(diag::DefParamTargetChange, getRange());
                    diag << prevEntry.pathStr;
                    diag << target->getHierarchicalPath();
                    return;
                }

                if (prevEntry.value != v.found[j]->getValue()) {
                    allSame = false;
                    if (i == options.maxDefParamSteps - 1)
                        root->addDiag(diag::DefParamCycle, getRange());
                    break;
                }
            }

            if (allSame)
                break;

            saveState(v, c);
        }

        // If we gave up due to a potential infinite loop, continue exiting.
        if (!allSame)
            break;

        if (nextIt())
            break;
    }

    // We have our final overrides; copy them into the main compilation unit.
    copyStateInto(*this, true);
}